

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
          (AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *this,Dispatch_State *t_e)

{
  int *piVar1;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar2;
  
  piVar1 = (int *)(**(code **)(**(long **)(*in_RDX + 0xf0) + 0x10))();
  *piVar1 = *piVar1 + 1;
  (**(code **)((long)&(((t_e->m_engine)._M_data)->m_mutex)._M_impl._M_rwlock + 0x20))(this,t_e);
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval(const chaiscript::detail::Dispatch_State &t_e) const final {
        try {
          T::trace(t_e, this);
          return eval_internal(t_e);
        } catch (exception::eval_error &ee) {
          ee.call_stack.push_back(*this);
          throw;
        }
      }